

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

Resource getTableItemByKeyPath(ResourceData *pResData,Resource table,char *key)

{
  UBool UVar1;
  StringPiece s;
  bool local_cb;
  char *local_c0;
  char *pathP;
  char *pcStack_b0;
  int32_t t;
  char *nextPathPart;
  char *pcStack_a0;
  UResType type;
  char *pathPart;
  undefined1 local_88 [12];
  UErrorCode local_74;
  undefined1 local_70 [4];
  UErrorCode errorCode;
  CharString path;
  Resource resource;
  char *key_local;
  Resource table_local;
  ResourceData *pResData_local;
  
  path._60_4_ = table;
  icu_63::CharString::CharString((CharString *)local_70);
  local_74 = U_ZERO_ERROR;
  icu_63::StringPiece::StringPiece((StringPiece *)local_88,key);
  s._12_4_ = 0;
  s.ptr_ = (char *)local_88._0_8_;
  s.length_ = local_88._8_4_;
  icu_63::CharString::append((CharString *)local_70,s,&local_74);
  UVar1 = U_FAILURE(local_74);
  if (UVar1 == '\0') {
    pcStack_a0 = icu_63::CharString::data((CharString *)local_70);
    while( true ) {
      nextPathPart._4_4_ = (uint)path._60_4_ >> 0x1c;
      local_cb = false;
      if ((((*pcStack_a0 != '\0') && (local_cb = false, path._60_4_ != -1)) &&
          (local_cb = true, nextPathPart._4_4_ != 2)) &&
         ((local_cb = true, nextPathPart._4_4_ != 5 && (local_cb = true, nextPathPart._4_4_ != 4))))
      {
        local_cb = nextPathPart._4_4_ == 8 || nextPathPart._4_4_ == 9;
      }
      if (!local_cb) break;
      pcStack_b0 = strchr(pcStack_a0,0x2f);
      if (pcStack_b0 == (char *)0x0) {
        pcStack_b0 = strchr(pcStack_a0,0);
      }
      else {
        *pcStack_b0 = '\0';
        pcStack_b0 = pcStack_b0 + 1;
      }
      local_c0 = pcStack_a0;
      path._60_4_ = res_getTableItemByKey_63
                              (pResData,path._60_4_,(int32_t *)((long)&pathP + 4),&local_c0);
      pcStack_a0 = pcStack_b0;
    }
    if (*pcStack_a0 == '\0') {
      pResData_local._4_4_ = path._60_4_;
    }
    else {
      pResData_local._4_4_ = 0xffffffff;
    }
  }
  else {
    pResData_local._4_4_ = 0xffffffff;
  }
  pathPart._0_4_ = 1;
  icu_63::CharString::~CharString((CharString *)local_70);
  return pResData_local._4_4_;
}

Assistant:

static Resource getTableItemByKeyPath(const ResourceData *pResData, Resource table, const char *key) {
  Resource resource = table;  /* The current resource */
  icu::CharString path;
  UErrorCode errorCode = U_ZERO_ERROR;
  path.append(key, errorCode);
  if (U_FAILURE(errorCode)) { return RES_BOGUS; }
  char *pathPart = path.data();  /* Path from current resource to desired resource */
  UResType type = (UResType)RES_GET_TYPE(resource);  /* the current resource type */
  while (*pathPart && resource != RES_BOGUS && URES_IS_CONTAINER(type)) {
    char *nextPathPart = uprv_strchr(pathPart, RES_PATH_SEPARATOR);
    if (nextPathPart != NULL) {
      *nextPathPart = 0;  /* Terminating null for this part of path. */
      nextPathPart++;
    } else {
      nextPathPart = uprv_strchr(pathPart, 0);
    }
    int32_t t;
    const char *pathP = pathPart;
    resource = res_getTableItemByKey(pResData, resource, &t, &pathP);
    type = (UResType)RES_GET_TYPE(resource);
    pathPart = nextPathPart; 
  }
  if (*pathPart) {
    return RES_BOGUS;
  }
  return resource;
}